

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExecProgramCommand.cxx
# Opt level: O1

bool anon_unknown.dwarf_4806bd::RunCommand
               (string *command,string *output,int *retVal,char *dir,bool verbose,Encoding encoding)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  cmsysProcess *cp;
  undefined8 uVar6;
  _Alloc_hider _Var7;
  undefined7 in_register_00000081;
  byte bVar8;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  cmProcessOutput processOutput;
  int length;
  string strdata;
  char *data;
  string msg;
  string commandInDir;
  char *cmd [4];
  cmProcessOutput local_15d;
  int local_15c;
  int *local_158;
  string *local_150;
  undefined4 local_144;
  string local_140;
  char *local_120;
  undefined1 *local_118;
  long local_110;
  undefined1 local_108;
  undefined7 uStack_107;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_f8;
  undefined8 local_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  string local_d8;
  char *local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  char *local_a0;
  undefined8 local_98;
  size_type local_90;
  pointer local_88;
  undefined8 local_80;
  string local_70;
  string local_50;
  
  bVar3 = cmSystemTools::s_DisableRunCommandOutput;
  local_158 = retVal;
  local_150 = output;
  cp = cmsysProcess_New();
  if (cp == (cmsysProcess *)0x0) {
    local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_d8,"Error allocating process instance.","");
    cmSystemTools::Error(&local_d8);
    uVar6 = local_d8.field_2._M_allocated_capacity;
    _Var7._M_p = local_d8._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p == &local_d8.field_2) goto LAB_00208311;
    goto LAB_00208309;
  }
  local_f8 = &local_e8;
  local_f0 = 0;
  local_e8._M_local_buf[0] = '\0';
  if (dir == (char *)0x0) {
    std::__cxx11::string::_M_assign((string *)&local_f8);
  }
  else {
    local_144 = (undefined4)CONCAT71(in_register_00000081,verbose);
    local_d8._M_dataplus._M_p = (pointer)0x4;
    local_d8._M_string_length = 0x7c37fd;
    local_d8.field_2._M_allocated_capacity = 0;
    local_d8.field_2._8_8_ = strlen(dir);
    local_b0 = 0;
    local_a8 = 5;
    local_a0 = "\" && ";
    local_98 = 0;
    local_88 = (command->_M_dataplus)._M_p;
    local_90 = command->_M_string_length;
    local_80 = 0;
    views._M_len = 4;
    views._M_array = (iterator)&local_d8;
    local_b8 = dir;
    cmCatViews(&local_140,views);
    std::__cxx11::string::operator=((string *)&local_f8,(string *)&local_140);
    verbose = SUB41(local_144,0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != &local_140.field_2) {
      operator_delete(local_140._M_dataplus._M_p,
                      CONCAT71(local_140.field_2._M_allocated_capacity._1_7_,
                               local_140.field_2._M_local_buf[0]) + 1);
    }
  }
  std::__cxx11::string::append((char *)&local_f8);
  std::__cxx11::string::_M_assign((string *)command);
  bVar8 = ~bVar3 & verbose;
  if (bVar8 != 0) {
    paVar1 = &local_d8.field_2;
    local_d8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"running ","");
    cmSystemTools::Stdout(&local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != paVar1) {
      operator_delete(local_d8._M_dataplus._M_p,(ulong)(local_d8.field_2._M_allocated_capacity + 1))
      ;
    }
    cmSystemTools::Stdout(command);
    local_d8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"\n","");
    cmSystemTools::Stdout(&local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != paVar1) {
      operator_delete(local_d8._M_dataplus._M_p,(ulong)(local_d8.field_2._M_allocated_capacity + 1))
      ;
    }
  }
  fflush(_stdout);
  fflush(_stderr);
  local_d8._M_dataplus._M_p = "/bin/sh";
  local_d8._M_string_length = 0x8179d7;
  local_d8.field_2._M_allocated_capacity = (size_type)(command->_M_dataplus)._M_p;
  local_d8.field_2._8_8_ = 0;
  cmsysProcess_SetCommand(cp,(char **)&local_d8);
  cmsysProcess_Execute(cp);
  cmProcessOutput::cmProcessOutput(&local_15d,Auto,0x400);
  local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
  local_140._M_string_length = 0;
  local_140.field_2._M_local_buf[0] = '\0';
  while (uVar4 = cmsysProcess_WaitForData(cp,&local_120,&local_15c,(double *)0x0), uVar4 != 0) {
    if ((uVar4 & 0xfffffffe) == 2) {
      if (bVar8 != 0) {
        cmProcessOutput::DecodeText(&local_15d,local_120,(long)local_15c,&local_140,0);
        cmSystemTools::Stdout(&local_140);
      }
      std::__cxx11::string::append((char *)local_150,(ulong)local_120);
    }
  }
  if (bVar8 != 0) {
    local_50._M_string_length = 0;
    local_50.field_2._M_local_buf[0] = '\0';
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    cmProcessOutput::DecodeText(&local_15d,&local_50,&local_140,0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,
                      CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                               local_50.field_2._M_local_buf[0]) + 1);
    }
    if (local_140._M_string_length != 0) {
      cmSystemTools::Stdout(&local_140);
    }
  }
  cmsysProcess_WaitForExit(cp,(double *)0x0);
  pcVar2 = (local_150->_M_dataplus)._M_p;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar2,pcVar2 + local_150->_M_string_length);
  cmProcessOutput::DecodeText(&local_15d,&local_70,local_150,0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  local_110 = 0;
  local_108 = 0;
  local_118 = &local_108;
  iVar5 = cmsysProcess_GetState(cp);
  switch(iVar5) {
  case 1:
    *local_158 = -1;
    std::__cxx11::string::append((char *)&local_118);
    cmsysProcess_GetErrorString(cp);
    goto LAB_00208270;
  case 2:
    *local_158 = -1;
    std::__cxx11::string::append((char *)&local_118);
    cmsysProcess_GetExceptionString(cp);
LAB_00208270:
    std::__cxx11::string::append((char *)&local_118);
    break;
  case 4:
    iVar5 = cmsysProcess_GetExitValue(cp);
    *local_158 = iVar5;
    break;
  case 5:
    *local_158 = -1;
    std::__cxx11::string::append((char *)&local_118);
  }
  if (local_110 != 0) {
    std::__cxx11::string::_M_append((char *)local_150,(ulong)local_118);
  }
  cmsysProcess_Delete(cp);
  if (local_118 != &local_108) {
    operator_delete(local_118,CONCAT71(uStack_107,local_108) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != &local_140.field_2) {
    operator_delete(local_140._M_dataplus._M_p,
                    CONCAT71(local_140.field_2._M_allocated_capacity._1_7_,
                             local_140.field_2._M_local_buf[0]) + 1);
  }
  if (local_f8 != &local_e8) {
    uVar6 = (pointer)CONCAT71(local_e8._M_allocated_capacity._1_7_,local_e8._M_local_buf[0]);
    _Var7._M_p = (pointer)local_f8;
LAB_00208309:
    operator_delete(_Var7._M_p,(ulong)(uVar6 + 1));
  }
LAB_00208311:
  return cp != (cmsysProcess *)0x0;
}

Assistant:

bool RunCommand(std::string command, std::string& output, int& retVal,
                const char* dir, bool verbose, Encoding encoding)
{
  if (cmSystemTools::GetRunCommandOutput()) {
    verbose = false;
  }

#if defined(_WIN32) && !defined(__CYGWIN__)
  // if the command does not start with a quote, then
  // try to find the program, and if the program can not be
  // found use system to run the command as it must be a built in
  // shell command like echo or dir
  if (!command.empty() && command[0] == '\"') {
    // count the number of quotes
    int count = 0;
    for (char c : command) {
      if (c == '\"') {
        count++;
        if (count > 2) {
          break;
        }
      }
    }
    // if there are more than two double quotes use
    // GetShortPathName, the cmd.exe program in windows which
    // is used by system fails to execute if there are more than
    // one set of quotes in the arguments
    if (count > 2) {
      cmsys::RegularExpression quoted("^\"([^\"]*)\"[ \t](.*)");
      if (quoted.find(command)) {
        std::string shortCmd;
        std::string cmd = quoted.match(1);
        std::string args = quoted.match(2);
        if (!cmSystemTools::FileExists(cmd)) {
          shortCmd = cmd;
        } else if (!cmSystemTools::GetShortPath(cmd, shortCmd)) {
          cmSystemTools::Error("GetShortPath failed for " + cmd);
          return false;
        }
        shortCmd += " ";
        shortCmd += args;

        command = shortCmd;
      } else {
        cmSystemTools::Error("Could not parse command line with quotes " +
                             command);
      }
    }
  }
#endif

  // Allocate a process instance.
  cmsysProcess* cp = cmsysProcess_New();
  if (!cp) {
    cmSystemTools::Error("Error allocating process instance.");
    return false;
  }

#if defined(_WIN32) && !defined(__CYGWIN__)
  if (dir) {
    cmsysProcess_SetWorkingDirectory(cp, dir);
  }
  if (cmSystemTools::GetRunCommandHideConsole()) {
    cmsysProcess_SetOption(cp, cmsysProcess_Option_HideWindow, 1);
  }
  cmsysProcess_SetOption(cp, cmsysProcess_Option_Verbatim, 1);
  const char* cmd[] = { command.c_str(), nullptr };
  cmsysProcess_SetCommand(cp, cmd);
#else
  std::string commandInDir;
  if (dir) {
    commandInDir = cmStrCat("cd \"", dir, "\" && ", command);
  } else {
    commandInDir = command;
  }
#  ifndef __VMS
  commandInDir += " 2>&1";
#  endif
  command = commandInDir;
  if (verbose) {
    cmSystemTools::Stdout("running ");
    cmSystemTools::Stdout(command);
    cmSystemTools::Stdout("\n");
  }
  fflush(stdout);
  fflush(stderr);
  const char* cmd[] = { "/bin/sh", "-c", command.c_str(), nullptr };
  cmsysProcess_SetCommand(cp, cmd);
#endif

  cmsysProcess_Execute(cp);

  // Read the process output.
  int length;
  char* data;
  int p;
  cmProcessOutput processOutput(encoding);
  std::string strdata;
  while ((p = cmsysProcess_WaitForData(cp, &data, &length, nullptr))) {
    if (p == cmsysProcess_Pipe_STDOUT || p == cmsysProcess_Pipe_STDERR) {
      if (verbose) {
        processOutput.DecodeText(data, length, strdata);
        cmSystemTools::Stdout(strdata);
      }
      output.append(data, length);
    }
  }

  if (verbose) {
    processOutput.DecodeText(std::string(), strdata);
    if (!strdata.empty()) {
      cmSystemTools::Stdout(strdata);
    }
  }

  // All output has been read.  Wait for the process to exit.
  cmsysProcess_WaitForExit(cp, nullptr);
  processOutput.DecodeText(output, output);

  // Check the result of running the process.
  std::string msg;
  switch (cmsysProcess_GetState(cp)) {
    case cmsysProcess_State_Exited:
      retVal = cmsysProcess_GetExitValue(cp);
      break;
    case cmsysProcess_State_Exception:
      retVal = -1;
      msg += "\nProcess terminated due to: ";
      msg += cmsysProcess_GetExceptionString(cp);
      break;
    case cmsysProcess_State_Error:
      retVal = -1;
      msg += "\nProcess failed because: ";
      msg += cmsysProcess_GetErrorString(cp);
      break;
    case cmsysProcess_State_Expired:
      retVal = -1;
      msg += "\nProcess terminated due to timeout.";
      break;
  }
  if (!msg.empty()) {
#if defined(_WIN32) && !defined(__CYGWIN__)
    // Old Windows process execution printed this info.
    msg += "\n\nfor command: ";
    msg += command;
    if (dir) {
      msg += "\nin dir: ";
      msg += dir;
    }
    msg += "\n";
    if (verbose) {
      cmSystemTools::Stdout(msg);
    }
    output += msg;
#else
    // Old UNIX process execution only put message in output.
    output += msg;
#endif
  }

  // Delete the process instance.
  cmsysProcess_Delete(cp);

  return true;
}